

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O0

int cmime_string_is_7bit(char *s)

{
  byte *local_20;
  char *it;
  char *s_local;
  
  local_20 = (byte *)s;
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                  ,100,"int cmime_string_is_7bit(const char *)");
  }
  while( true ) {
    if (*local_20 == 0) {
      return 0;
    }
    if ((0x7f < *local_20) || ((char)*local_20 < '\0')) break;
    local_20 = local_20 + 1;
  }
  return -1;
}

Assistant:

int cmime_string_is_7bit(const char *s) {
    const char *it = NULL;
    assert(s);

    it = s;
    while(*it != '\0') {
        if (((unsigned char)(*it) > (unsigned char) 127)||(*it < 0))
            return(-1);
        it++;
    }

    return(0);
}